

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

optional<long_long> __thiscall
QXmlStreamReaderPrivate::fastScanName(QXmlStreamReaderPrivate *this,Value *val)

{
  long lVar1;
  uint uVar2;
  uint *puVar3;
  _Storage<long_long,_true> _Var4;
  ulong unaff_RBP;
  uint7 uVar6;
  ulong uVar5;
  long from;
  QStringView s;
  optional<long_long> oVar7;
  
  _Var4._M_value = 0;
  do {
    uVar2 = getChar(this);
    if (uVar2 == 0xffffffff) {
      if (val != (Value *)0x0) {
        val->prefix = 0;
      }
      lVar1 = (this->textBuffer).d.size;
      from = lVar1 - (long)_Var4;
      s.m_data = (this->textBuffer).d.ptr;
      s.m_size = lVar1;
      putString(this,s,from);
      QString::resize(&this->textBuffer,from);
      uVar5 = CONCAT71((int7)(unaff_RBP >> 8),1);
      _Var4._M_value = 0;
LAB_0035a122:
      oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
      super__Optional_payload_base<long_long>._8_8_ = uVar5 & 0xffffffff;
      oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
      super__Optional_payload_base<long_long>._M_payload._M_value = _Var4._M_value;
      return (optional<long_long>)
             oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long>;
    }
    if (_Var4._M_value == 0x1000) {
      raiseNamePrefixTooLongError(this);
      uVar5 = 0;
      goto LAB_0035a122;
    }
    unaff_RBP = (ulong)uVar2;
    uVar6 = (uint7)(uint3)(uVar2 >> 8);
    if (uVar2 < 0x40) {
      if ((ulong)uVar2 != 0x3a) {
        if ((0xf8009fef00002600U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_0035a039;
        goto LAB_0035a07f;
      }
      if ((val == (Value *)0x0) || (val->prefix != 0)) {
        puVar3 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
        *puVar3 = 0x3a;
        uVar5 = CONCAT71(uVar6,1);
        goto LAB_0035a122;
      }
      val->prefix = (short)_Var4._M_value + 2;
    }
    else {
LAB_0035a039:
      if ((uVar2 - 0x5b < 0x22) && ((0x20000000dU >> ((ulong)(uVar2 - 0x5b) & 0x3f) & 1) != 0)) {
LAB_0035a07f:
        puVar3 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
        *puVar3 = uVar2;
        uVar5 = CONCAT71(uVar6,1);
        if ((val != (Value *)0x0) && ((long)val->prefix + -1 == _Var4._M_value)) {
          val->prefix = 0;
          puVar3 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
          *puVar3 = 0x3a;
          _Var4._M_value = _Var4._M_value + -1;
        }
        goto LAB_0035a122;
      }
    }
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar2);
    _Var4._M_value = _Var4._M_value + 1;
  } while( true );
}

Assistant:

inline std::optional<qsizetype> QXmlStreamReaderPrivate::fastScanName(Value *val)
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        if (n >= 4096) {
            // This is too long to be a sensible name, and
            // can exhaust memory, or the range of decltype(*prefix)
            raiseNamePrefixTooLongError();
            return std::nullopt;
        }
        switch (c) {
        case '\n':
        case ' ':
        case '\t':
        case '\r':
        case '&':
        case '#':
        case '\'':
        case '\"':
        case '<':
        case '>':
        case '[':
        case ']':
        case '=':
        case '%':
        case '/':
        case ';':
        case '?':
        case '!':
        case '^':
        case '|':
        case ',':
        case '(':
        case ')':
        case '+':
        case '*':
            putChar(c);
            if (val && val->prefix == n + 1) {
                val->prefix = 0;
                putChar(':');
                --n;
            }
            return n;
        case ':':
            if (val) {
                if (val->prefix == 0) {
                    val->prefix = qint16(n + 2);
                } else { // only one colon allowed according to the namespace spec.
                    putChar(c);
                    return n;
                }
            } else {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }

    if (val)
        val->prefix = 0;
    qsizetype pos = textBuffer.size() - n;
    putString(textBuffer, pos);
    textBuffer.resize(pos);
    return 0;
}